

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int codebook_decode_scalar_raw(vorb *f,Codebook *c)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint8 *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint32 *puVar9;
  uint uVar10;
  uint uVar11;
  
  if (f->valid_bits < 0x19) {
    if (f->valid_bits == 0) {
      f->acc = 0;
    }
    do {
      if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
         (iVar5 = get8_packet_raw(f), iVar5 == -1)) break;
      iVar2 = f->valid_bits;
      f->acc = f->acc + (iVar5 << ((byte)iVar2 & 0x1f));
      f->valid_bits = iVar2 + 8;
    } while (iVar2 < 0x11);
  }
  if (c->codewords == (uint32 *)0x0) {
    puVar9 = c->sorted_codewords;
    if (puVar9 == (uint32 *)0x0) {
      return -1;
    }
LAB_0018f9ad:
    uVar3 = f->acc;
    uVar10 = c->sorted_entries;
    uVar8 = 0;
    if (1 < (int)uVar10) {
      uVar6 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar6 = (uVar6 & 0xf0f0f0f) << 4 | uVar6 >> 4 & 0xf0f0f0f;
      uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333) * 4;
      uVar7 = 0;
      do {
        uVar11 = uVar10 >> 1;
        uVar8 = (ulong)(uVar11 + uVar7);
        if ((uVar6 >> 1 & 0x55555555) + (uVar6 & 0x55555555) * 2 < puVar9[uVar8]) {
          uVar8 = (ulong)uVar7;
          uVar10 = uVar11;
        }
        else {
          uVar10 = uVar10 - uVar11;
        }
        uVar7 = (uint)uVar8;
      } while (1 < (int)uVar10);
    }
    if (c->sparse == '\0') {
      uVar8 = (ulong)(uint)c->sorted_values[uVar8];
    }
    bVar1 = c->codeword_lengths[(int)uVar8];
    iVar5 = f->valid_bits - (uint)bVar1;
    if ((int)(uint)bVar1 <= f->valid_bits) {
      f->acc = uVar3 >> (bVar1 & 0x1f);
      goto LAB_0018faa8;
    }
  }
  else {
    uVar3 = c->entries;
    if ((int)uVar3 < 9) {
      if (0 < (int)uVar3) goto LAB_0018fa61;
    }
    else {
      puVar9 = c->sorted_codewords;
      if (puVar9 != (uint32 *)0x0) goto LAB_0018f9ad;
LAB_0018fa61:
      puVar4 = c->codeword_lengths;
      uVar8 = 0;
      do {
        bVar1 = puVar4[uVar8];
        if ((bVar1 != 0xff) && (c->codewords[uVar8] == (~(-1 << (bVar1 & 0x1f)) & f->acc))) {
          if (f->valid_bits < (int)(uint)bVar1) goto LAB_0018faa1;
          f->acc = f->acc >> (bVar1 & 0x1f);
          iVar5 = f->valid_bits - (uint)puVar4[uVar8];
          goto LAB_0018faa8;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    f->error = VORBIS_invalid_stream;
  }
LAB_0018faa1:
  uVar8 = 0xffffffff;
  iVar5 = 0;
LAB_0018faa8:
  f->valid_bits = iVar5;
  return (int)uVar8;
}

Assistant:

static int codebook_decode_scalar_raw(vorb *f, Codebook *c)
{
   int i;
   prep_huffman(f);

   if (c->codewords == NULL && c->sorted_codewords == NULL)
      return -1;

   // cases to use binary search: sorted_codewords && !c->codewords
   //                             sorted_codewords && c->entries > 8
   if (c->entries > 8 ? c->sorted_codewords!=NULL : !c->codewords) {
      // binary search
      uint32 code = bit_reverse(f->acc);
      int x=0, n=c->sorted_entries, len;

      while (n > 1) {
         // invariant: sc[x] <= code < sc[x+n]
         int m = x + (n >> 1);
         if (c->sorted_codewords[m] <= code) {
            x = m;
            n -= (n>>1);
         } else {
            n >>= 1;
         }
      }
      // x is now the sorted index
      if (!c->sparse) x = c->sorted_values[x];
      // x is now sorted index if sparse, or symbol otherwise
      len = c->codeword_lengths[x];
      if (f->valid_bits >= len) {
         f->acc >>= len;
         f->valid_bits -= len;
         return x;
      }

      f->valid_bits = 0;
      return -1;
   }

   // if small, linear search
   assert(!c->sparse);
   for (i=0; i < c->entries; ++i) {
      if (c->codeword_lengths[i] == NO_CODE) continue;
      if (c->codewords[i] == (f->acc & ((1 << c->codeword_lengths[i])-1))) {
         if (f->valid_bits >= c->codeword_lengths[i]) {
            f->acc >>= c->codeword_lengths[i];
            f->valid_bits -= c->codeword_lengths[i];
            return i;
         }
         f->valid_bits = 0;
         return -1;
      }
   }

   error(f, VORBIS_invalid_stream);
   f->valid_bits = 0;
   return -1;
}